

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManCollectDfs_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] != p->nTravIds) {
    p->pTravIds[iObj] = p->nTravIds;
    if ((iObj < 0) || (p->nObjs <= iObj)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = p->pObjs;
    uVar2 = (uint)*(undefined8 *)(pGVar1 + (uint)iObj);
    if (-1 < (int)uVar2 && (~uVar2 & 0x1fffffff) != 0) {
      Gia_ManCollectDfs_rec(p,iObj - (uVar2 & 0x1fffffff),vNodes);
      Gia_ManCollectDfs_rec(p,iObj - (*(uint *)&pGVar1[(uint)iObj].field_0x4 & 0x1fffffff),vNodes);
      Vec_IntPush(vNodes,iObj);
      return;
    }
  }
  return;
}

Assistant:

void Gia_ManCollectDfs_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Gia_ManCollectDfs_rec( p, Gia_ObjFaninId0(pObj, iObj), vNodes );
    Gia_ManCollectDfs_rec( p, Gia_ObjFaninId1(pObj, iObj), vNodes );
    Vec_IntPush( vNodes, iObj );
}